

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void test_qpixl_frqi_util_inv_gray_permutation<double>(void)

{
  double *lhs;
  long lVar1;
  ulong uVar2;
  value_type *__val;
  undefined8 *puVar3;
  internal *piVar4;
  char *pcVar5;
  byte bVar6;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> a_c;
  vector<double,_std::allocator<double>_> a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  AssertHelper local_c8;
  internal local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8 [15];
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  
  bVar6 = 0;
  puVar3 = &DAT_00168398;
  piVar4 = local_c0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)piVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    piVar4 = piVar4 + 8;
  }
  __l._M_len = 0x10;
  __l._M_array = (iterator)local_c0;
  std::vector<double,_std::allocator<double>_>::vector(&local_28,__l,(allocator_type *)&local_40);
  puVar3 = &DAT_00168398;
  piVar4 = local_c0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)piVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
    piVar4 = piVar4 + ((ulong)bVar6 * -2 + 1) * 8;
  }
  __l_00._M_len = 0x10;
  __l_00._M_array = (iterator)local_c0;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,__l_00,(allocator_type *)&local_d0)
  ;
  lhs = (double *)operator_new(0x80);
  lhs[0xe] = 0.0;
  lhs[0xf] = 0.0;
  lhs[0xc] = 0.0;
  lhs[0xd] = 0.0;
  lhs[10] = 0.0;
  lhs[0xb] = 0.0;
  lhs[8] = 0.0;
  lhs[9] = 0.0;
  lhs[6] = 0.0;
  lhs[7] = 0.0;
  lhs[4] = 0.0;
  lhs[5] = 0.0;
  lhs[2] = 0.0;
  lhs[3] = 0.0;
  *lhs = 0.0;
  lhs[1] = 0.0;
  qpixl::frqi::grayPermutation<std::vector<double,std::allocator<double>>>(&local_28);
  if ((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0x80) {
    if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      uVar2 = 0;
      do {
        lhs[uVar2 >> 1 ^ uVar2] =
             local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x10);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 0]","a_c[ 0]",lhs,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe2,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 1]","a_c[ 1]",lhs + 1,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 2]","a_c[ 2]",lhs + 2,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 2);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 3]","a_c[ 3]",lhs + 3,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 3);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 4]","a_c[ 4]",lhs + 4,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 4);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 5]","a_c[ 5]",lhs + 5,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 5);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 6]","a_c[ 6]",lhs + 6,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 6);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 7]","a_c[ 7]",lhs + 7,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 7);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xe9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 8]","a_c[ 8]",lhs + 8,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 8);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xea,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[ 9]","a_c[ 9]",lhs + 9,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 9);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xeb,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[10]","a_c[10]",lhs + 10,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 10);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xec,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[11]","a_c[11]",lhs + 0xb,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xb);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xed,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[12]","a_c[12]",lhs + 0xc,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xc);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xee,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[13]","a_c[13]",lhs + 0xd,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xd);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xef,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[14]","a_c[14]",lhs + 0xe,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xe);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf0,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a_out[15]","a_c[15]",lhs + 0xf,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xf);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf1,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    qpixl::frqi::invGrayPermutation<std::vector<double,std::allocator<double>>>(&local_28);
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 0]","a_c[ 0]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 1]","a_c[ 1]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 2]","a_c[ 2]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 2,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 2);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 3]","a_c[ 3]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 3,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 3);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 4]","a_c[ 4]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 4,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 4);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 5]","a_c[ 5]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 5,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 5);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xf9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 6]","a_c[ 6]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 6,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 6);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xfa,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 7]","a_c[ 7]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 7,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 7);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xfb,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 8]","a_c[ 8]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 8,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 8);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xfc,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[ 9]","a_c[ 9]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 9,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 9);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xfd,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[10]","a_c[10]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 10,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 10);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xfe,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[11]","a_c[11]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xb,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xb);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0xff,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[12]","a_c[12]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xc,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xc);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0x100,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[13]","a_c[13]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xd,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xd);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0x101,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[14]","a_c[14]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xe,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xe);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0x102,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    testing::internal::CmpHelperEQ<double,double>
              (local_c0,"a[15]","a_c[15]",
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xf,
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 0xf);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_b8[0]->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0x103,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,local_b8[0]);
    }
    operator_delete(lhs,0x80);
    if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("n == b.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/include/qpixl/frqi/util.hpp"
                ,0x5e,
                "void qpixl::frqi::invGrayPermutation(const V &, V &) [V = std::vector<double>]");
}

Assistant:

void test_qpixl_frqi_util_inv_gray_permutation() {
  std::vector< R > a = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 , 
                         10 , 11 , 12 , 13 , 14 , 15 , 16  } ;
  std::vector< R > a_c = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 , 
                         10 , 11 , 12 , 13 , 14 , 15 , 16 };
  std::vector< R > a_out( 16 ) ;
  qpixl::frqi::grayPermutation( a ) ;
    {
    // with copy
    qpixl::frqi::invGrayPermutation( a , a_out ) ;
    EXPECT_EQ( a_out[ 0] , a_c[ 0] );
    EXPECT_EQ( a_out[ 1] , a_c[ 1] );
    EXPECT_EQ( a_out[ 2] , a_c[ 2] );
    EXPECT_EQ( a_out[ 3] , a_c[ 3] );
    EXPECT_EQ( a_out[ 4] , a_c[ 4] );
    EXPECT_EQ( a_out[ 5] , a_c[ 5] );
    EXPECT_EQ( a_out[ 6] , a_c[ 6] );
    EXPECT_EQ( a_out[ 7] , a_c[ 7] );
    EXPECT_EQ( a_out[ 8] , a_c[ 8] );
    EXPECT_EQ( a_out[ 9] , a_c[ 9] );
    EXPECT_EQ( a_out[10] , a_c[10] );
    EXPECT_EQ( a_out[11] , a_c[11] );
    EXPECT_EQ( a_out[12] , a_c[12] );
    EXPECT_EQ( a_out[13] , a_c[13] );
    EXPECT_EQ( a_out[14] , a_c[14] );
    EXPECT_EQ( a_out[15] , a_c[15] );
    // in-place
    qpixl::frqi::invGrayPermutation( a ) ;
    EXPECT_EQ( a[ 0] , a_c[ 0] );
    EXPECT_EQ( a[ 1] , a_c[ 1] );
    EXPECT_EQ( a[ 2] , a_c[ 2] );
    EXPECT_EQ( a[ 3] , a_c[ 3] );
    EXPECT_EQ( a[ 4] , a_c[ 4] );
    EXPECT_EQ( a[ 5] , a_c[ 5] );
    EXPECT_EQ( a[ 6] , a_c[ 6] );
    EXPECT_EQ( a[ 7] , a_c[ 7] );
    EXPECT_EQ( a[ 8] , a_c[ 8] );
    EXPECT_EQ( a[ 9] , a_c[ 9] );
    EXPECT_EQ( a[10] , a_c[10] );
    EXPECT_EQ( a[11] , a_c[11] );
    EXPECT_EQ( a[12] , a_c[12] );
    EXPECT_EQ( a[13] , a_c[13] );
    EXPECT_EQ( a[14] , a_c[14] );
    EXPECT_EQ( a[15] , a_c[15] );
  }

}